

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall
cfgfile::parser_t<cfgfile::string_trait_t>::parser_t
          (parser_t<cfgfile::string_trait_t> *this,tag_t<cfgfile::string_trait_t> *tag,
          input_stream_t<cfgfile::string_trait_t> *stream)

{
  unique_ptr<cfgfile::details::parser_conffile_impl_t<cfgfile::string_trait_t>,_std::default_delete<cfgfile::details::parser_conffile_impl_t<cfgfile::string_trait_t>_>_>
  *in_RDX;
  unique_ptr<cfgfile::details::parser_base_t<cfgfile::string_trait_t>,_std::default_delete<cfgfile::details::parser_base_t<cfgfile::string_trait_t>_>_>
  *in_RSI;
  input_stream_t<cfgfile::string_trait_t> *unaff_retaddr;
  tag_t<cfgfile::string_trait_t> *in_stack_00000008;
  unique_ptr<cfgfile::details::parser_conffile_impl_t<cfgfile::string_trait_t>,_std::default_delete<cfgfile::details::parser_conffile_impl_t<cfgfile::string_trait_t>_>_>
  *in_stack_ffffffffffffffe0;
  
  std::
  make_unique<cfgfile::details::parser_conffile_impl_t<cfgfile::string_trait_t>,cfgfile::tag_t<cfgfile::string_trait_t>&,cfgfile::input_stream_t<cfgfile::string_trait_t>&>
            (in_stack_00000008,unaff_retaddr);
  std::
  unique_ptr<cfgfile::details::parser_base_t<cfgfile::string_trait_t>,std::default_delete<cfgfile::details::parser_base_t<cfgfile::string_trait_t>>>
  ::
  unique_ptr<cfgfile::details::parser_conffile_impl_t<cfgfile::string_trait_t>,std::default_delete<cfgfile::details::parser_conffile_impl_t<cfgfile::string_trait_t>>,void>
            (in_RSI,in_RDX);
  std::
  unique_ptr<cfgfile::details::parser_conffile_impl_t<cfgfile::string_trait_t>,_std::default_delete<cfgfile::details::parser_conffile_impl_t<cfgfile::string_trait_t>_>_>
  ::~unique_ptr(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

parser_t( tag_t< Trait > & tag, input_stream_t< Trait > & stream )
		:	m_d( std::make_unique< details::parser_conffile_impl_t< Trait > >
				( tag, stream ) )
	{
	}